

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O1

double __thiscall
imrt::Plan::incremental_eval
          (Plan *this,Station *station,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  double dVar1;
  
  dVar1 = EvaluationFunction::incremental_eval
                    (this->ev,station,&this->w,&this->Zmin,&this->Zmax,diff);
  this->evaluation_fx = dVar1;
  this->last_changed = station;
  if (&this->last_diff != diff) {
    std::__cxx11::list<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
    _M_assign_dispatch<std::_List_const_iterator<std::pair<int,double>>>
              ((list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&this->last_diff
               ,(diff->
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
                _M_impl._M_node.super__List_node_base._M_next,diff);
  }
  return this->evaluation_fx;
}

Assistant:

double Plan::incremental_eval (Station& station, list< pair< int, double > >& diff) {
    evaluation_fx = ev.incremental_eval(station, w, Zmin, Zmax, diff);
    last_changed = &station;
    last_diff = diff;
    return(evaluation_fx);
  }